

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.cpp
# Opt level: O2

void __thiscall
qclab::qgates::QControlledGate2<std::complex<double>_>::apply
          (QControlledGate2<std::complex<double>_> *this,Side side,Op op,int nbQubits,
          SquareMatrix<std::complex<double>_> *matrix,int offset)

{
  undefined8 *puVar1;
  complex<double> *pcVar2;
  complex<double> *pcVar3;
  byte bVar4;
  byte bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  uint uVar14;
  int iVar15;
  int iVar16;
  undefined4 extraout_var;
  long lVar17;
  long lVar18;
  long lVar19;
  byte bVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  long lVar24;
  int iVar25;
  int64_t i;
  char *__assertion;
  long lVar26;
  long lVar27;
  long lVar28;
  ulong uVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Da_04;
  undefined4 extraout_XMM0_Da_05;
  undefined4 extraout_XMM0_Da_06;
  undefined4 extraout_XMM0_Da_07;
  undefined4 extraout_XMM0_Da_08;
  undefined4 extraout_XMM0_Da_09;
  undefined4 extraout_XMM0_Da_10;
  undefined4 extraout_XMM0_Da_11;
  undefined4 extraout_XMM0_Da_12;
  undefined4 extraout_XMM0_Da_13;
  undefined4 extraout_XMM0_Da_14;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Db_04;
  undefined4 extraout_XMM0_Db_05;
  undefined4 extraout_XMM0_Db_06;
  undefined4 extraout_XMM0_Db_07;
  undefined4 extraout_XMM0_Db_08;
  undefined4 extraout_XMM0_Db_09;
  undefined4 extraout_XMM0_Db_10;
  undefined4 extraout_XMM0_Db_11;
  undefined4 extraout_XMM0_Db_12;
  undefined4 extraout_XMM0_Db_13;
  undefined4 extraout_XMM0_Db_14;
  double in_XMM1_Qa;
  double dVar30;
  matrix_type mat1;
  long local_f0;
  undefined8 local_e8;
  undefined8 local_88;
  complex<double> x1;
  complex<double> x2;
  vector<int,_std::allocator<int>_> qubits;
  
  if (nbQubits < 2) {
    __assertion = "nbQubits >= 2";
    uVar14 = 0x2e;
  }
  else {
    bVar20 = (byte)nbQubits;
    if (matrix->size_ == (long)(1 << (bVar20 & 0x1f))) {
      (*(this->super_QGate2<std::complex<double>_>).super_QObject<std::complex<double>_>.
        _vptr_QObject[5])(&qubits);
      iVar15 = *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_start;
      *qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
           = iVar15 + offset;
      iVar16 = qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
               _M_start[1];
      qubits.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
      [1] = offset + iVar16;
      if (iVar15 + offset < nbQubits) {
        if (offset + iVar16 < nbQubits) {
          iVar15 = (*(this->super_QGate2<std::complex<double>_>).
                     super_QObject<std::complex<double>_>._vptr_QObject[0x10])();
          (**(code **)(*(long *)CONCAT44(extraout_var,iVar15) + 0x38))
                    (&mat1,(long *)CONCAT44(extraout_var,iVar15));
          dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>(op,&mat1);
          iVar15 = this->control_;
          iVar16 = (*(this->super_QGate2<std::complex<double>_>).
                     super_QObject<std::complex<double>_>._vptr_QObject[0xf])();
          if (iVar15 < iVar16) {
            iVar15 = (*(this->super_QGate2<std::complex<double>_>).
                       super_QObject<std::complex<double>_>._vptr_QObject[0xf])(this);
            bVar4 = (char)iVar15 - (char)this->control_ & 0x1f;
            iVar15 = (*(this->super_QGate2<std::complex<double>_>).
                       super_QObject<std::complex<double>_>._vptr_QObject[0xf])(this);
            iVar16 = (*(this->super_QGate2<std::complex<double>_>).
                       super_QObject<std::complex<double>_>._vptr_QObject[0xf])(this);
            bVar5 = (byte)iVar15 & 0x1f;
            lVar23 = (long)(1 << bVar4);
            lVar28 = (long)(1 << (~(byte)iVar16 + bVar20 & 0x1f));
            lVar24 = 0;
            if (0 < lVar28) {
              lVar24 = lVar28;
            }
            uVar14 = 1 << bVar5;
            if (1 << bVar5 < 1) {
              uVar14 = 0;
            }
            lVar17 = (long)((1 << bVar4) / 2);
            if (side == Left) {
              for (uVar29 = (ulong)(uint)(0 << bVar4); (long)uVar29 < matrix->size_;
                  uVar29 = uVar29 + 1) {
                local_e8 = 0.0;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  lVar22 = (long)local_e8;
                  lVar27 = lVar24;
                  if (this->controlState_ == 1) {
                    if (lVar17 <= (long)uVar21 % lVar23) goto LAB_00111678;
                  }
                  else if ((this->controlState_ != 0) || ((long)uVar21 % lVar23 < lVar17)) {
LAB_00111678:
                    while (lVar27 != 0) {
                      pcVar2 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      pcVar3 = pcVar2 + matrix->size_ * lVar22 + uVar29;
                      x1._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                      x1._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                      pcVar2 = pcVar2 + matrix->size_ * (lVar28 + lVar22) + uVar29;
                      x2._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
                      x2._M_value._8_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
                      std::operator*((complex<double> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl,&x1);
                      local_88 = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
                      dVar30 = in_XMM1_Qa;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10),&x2);
                      auVar6._8_4_ = SUB84(dVar30 + in_XMM1_Qa,0);
                      auVar6._0_8_ = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) +
                                     local_88;
                      auVar6._12_4_ = (int)((ulong)(dVar30 + in_XMM1_Qa) >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [matrix->size_ * lVar22 + uVar29]._M_value = auVar6;
                      std::operator*((complex<double> *)
                                     (mat1.size_ * 0x10 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x1);
                      local_88 = (double)CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
                      in_XMM1_Qa = dVar30;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                      auVar7._8_4_ = SUB84(in_XMM1_Qa + dVar30,0);
                      auVar7._0_8_ = (double)CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02) +
                                     local_88;
                      auVar7._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar30) >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [(lVar28 + lVar22) * matrix->size_ + uVar29]._M_value = auVar7;
                      lVar22 = lVar22 + 1;
                      lVar27 = lVar27 + -1;
                    }
                  }
                  local_e8 = (double)((long)local_e8 + lVar28 * 2);
                }
              }
            }
            else {
              uVar29 = (ulong)(uint)(0 << bVar4);
              for (lVar22 = 0; lVar22 < matrix->size_; lVar22 = lVar22 + 1) {
                local_e8 = 0.0;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  lVar27 = (long)local_e8;
                  lVar26 = lVar24;
                  if (this->controlState_ == 1) {
                    if (lVar17 <= (long)uVar21 % lVar23) goto LAB_00111c9c;
                  }
                  else if ((this->controlState_ != 0) || ((long)uVar21 % lVar23 < lVar17)) {
LAB_00111c9c:
                    while (lVar26 != 0) {
                      lVar19 = matrix->size_ * uVar29;
                      pcVar3 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar3->_M_value + lVar27 + lVar19);
                      x1._M_value._0_8_ = *puVar1;
                      x1._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)(pcVar3[lVar28]._M_value + lVar27 + lVar19);
                      x2._M_value._0_8_ = *puVar1;
                      x2._M_value._8_8_ = puVar1[1];
                      std::operator*((complex<double> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl,&x1);
                      local_88 = (double)CONCAT44(extraout_XMM0_Db_11,extraout_XMM0_Da_11);
                      dVar30 = in_XMM1_Qa;
                      std::operator*((complex<double> *)
                                     (mat1.size_ * 0x10 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x2);
                      auVar8._8_4_ = SUB84(dVar30 + in_XMM1_Qa,0);
                      auVar8._0_8_ = (double)CONCAT44(extraout_XMM0_Db_12,extraout_XMM0_Da_12) +
                                     local_88;
                      auVar8._12_4_ = (int)((ulong)(dVar30 + in_XMM1_Qa) >> 0x20);
                      *(undefined1 (*) [16])
                       (((matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + lVar27 + matrix->size_ * uVar29) = auVar8;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10),&x1);
                      local_88 = (double)CONCAT44(extraout_XMM0_Db_13,extraout_XMM0_Da_13);
                      in_XMM1_Qa = dVar30;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                      auVar9._8_4_ = SUB84(in_XMM1_Qa + dVar30,0);
                      auVar9._0_8_ = (double)CONCAT44(extraout_XMM0_Db_14,extraout_XMM0_Da_14) +
                                     local_88;
                      auVar9._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar30) >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar28].
                        _M_value + lVar27 + matrix->size_ * uVar29) = auVar9;
                      lVar27 = lVar27 + 0x10;
                      lVar26 = lVar26 + -1;
                    }
                  }
                  local_e8 = (double)((long)local_e8 + lVar28 * 0x20);
                }
                uVar29 = uVar29 + 0x10;
              }
            }
          }
          else {
            iVar25 = 1 << (bVar20 - (char)this->control_ & 0x1f);
            iVar15 = (*(this->super_QGate2<std::complex<double>_>).
                       super_QObject<std::complex<double>_>._vptr_QObject[0xf])(this);
            iVar16 = (*(this->super_QGate2<std::complex<double>_>).
                       super_QObject<std::complex<double>_>._vptr_QObject[0xf])(this);
            bVar4 = (byte)iVar15 & 0x1f;
            lVar23 = (long)iVar25;
            bVar20 = ~(byte)iVar16 + bVar20 & 0x1f;
            lVar28 = (long)(1 << bVar20);
            lVar24 = 0;
            if (0 < lVar28) {
              lVar24 = lVar28;
            }
            uVar14 = 1 << bVar4;
            if (1 << bVar4 < 1) {
              uVar14 = 0;
            }
            lVar17 = (long)(iVar25 / 2);
            if (side == Left) {
              for (uVar29 = (ulong)(uint)(0 << bVar20); (long)uVar29 < matrix->size_;
                  uVar29 = uVar29 + 1) {
                local_f0 = 0;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  for (lVar22 = 0; lVar24 != lVar22; lVar22 = lVar22 + 1) {
                    if (this->controlState_ == 1) {
                      if (lVar17 <= lVar22 % lVar23) goto LAB_001118dc;
                    }
                    else if ((this->controlState_ != 0) || (lVar22 % lVar23 < lVar17)) {
LAB_001118dc:
                      lVar27 = lVar28 + local_f0 + lVar22;
                      pcVar2 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      pcVar3 = pcVar2 + matrix->size_ * (local_f0 + lVar22) + uVar29;
                      x1._M_value._0_8_ = *(undefined8 *)pcVar3->_M_value;
                      x1._M_value._8_8_ = *(undefined8 *)(pcVar3->_M_value + 8);
                      pcVar2 = pcVar2 + matrix->size_ * lVar27 + uVar29;
                      x2._M_value._0_8_ = *(undefined8 *)pcVar2->_M_value;
                      x2._M_value._8_8_ = *(undefined8 *)(pcVar2->_M_value + 8);
                      std::operator*((complex<double> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl,&x1);
                      local_e8 = (double)CONCAT44(extraout_XMM0_Db_03,extraout_XMM0_Da_03);
                      dVar30 = in_XMM1_Qa;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10),&x2);
                      auVar10._8_4_ = SUB84(dVar30 + in_XMM1_Qa,0);
                      auVar10._0_8_ =
                           (double)CONCAT44(extraout_XMM0_Db_04,extraout_XMM0_Da_04) + local_e8;
                      auVar10._12_4_ = (int)((ulong)(dVar30 + in_XMM1_Qa) >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [(local_f0 + lVar22) * matrix->size_ + uVar29]._M_value = auVar10;
                      std::operator*((complex<double> *)
                                     (mat1.size_ * 0x10 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x1);
                      local_e8 = (double)CONCAT44(extraout_XMM0_Db_05,extraout_XMM0_Da_05);
                      in_XMM1_Qa = dVar30;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                      auVar11._8_4_ = SUB84(in_XMM1_Qa + dVar30,0);
                      auVar11._0_8_ =
                           (double)CONCAT44(extraout_XMM0_Db_06,extraout_XMM0_Da_06) + local_e8;
                      auVar11._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar30) >> 0x20);
                      *(undefined1 (*) [16])
                       (matrix->data_)._M_t.
                       super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                       .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl
                       [lVar27 * matrix->size_ + uVar29]._M_value = auVar11;
                    }
                  }
                  local_f0 = local_f0 + lVar28 * 2;
                }
              }
            }
            else {
              uVar29 = (ulong)(uint)(0 << bVar20);
              for (lVar22 = 0; lVar22 < matrix->size_; lVar22 = lVar22 + 1) {
                lVar27 = 0;
                for (uVar21 = 0; uVar21 != uVar14; uVar21 = uVar21 + 1) {
                  lVar26 = lVar27;
                  for (lVar19 = 0; lVar24 != lVar19; lVar19 = lVar19 + 1) {
                    if (this->controlState_ == 1) {
                      if (lVar17 <= lVar19 % lVar23) goto LAB_00111acf;
                    }
                    else if ((this->controlState_ != 0) || (lVar19 % lVar23 < lVar17)) {
LAB_00111acf:
                      lVar18 = matrix->size_ * uVar29;
                      pcVar3 = (matrix->data_)._M_t.
                               super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                               .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl;
                      puVar1 = (undefined8 *)(pcVar3->_M_value + lVar26 + lVar18);
                      x1._M_value._0_8_ = *puVar1;
                      x1._M_value._8_8_ = puVar1[1];
                      puVar1 = (undefined8 *)(pcVar3[lVar28]._M_value + lVar26 + lVar18);
                      x2._M_value._0_8_ = *puVar1;
                      x2._M_value._8_8_ = puVar1[1];
                      std::operator*((complex<double> *)
                                     mat1.data_._M_t.
                                     super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                     .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                     _M_head_impl,&x1);
                      local_e8 = (double)CONCAT44(extraout_XMM0_Db_07,extraout_XMM0_Da_07);
                      dVar30 = in_XMM1_Qa;
                      std::operator*((complex<double> *)
                                     (mat1.size_ * 0x10 +
                                     (long)mat1.data_._M_t.
                                           super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                           .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                           _M_head_impl),&x2);
                      auVar12._8_4_ = SUB84(dVar30 + in_XMM1_Qa,0);
                      auVar12._0_8_ =
                           (double)CONCAT44(extraout_XMM0_Db_08,extraout_XMM0_Da_08) + local_e8;
                      auVar12._12_4_ = (int)((ulong)(dVar30 + in_XMM1_Qa) >> 0x20);
                      *(undefined1 (*) [16])
                       (((matrix->data_)._M_t.
                         super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                         .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->
                        _M_value + lVar26 + matrix->size_ * uVar29) = auVar12;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + 0x10),&x1);
                      local_e8 = (double)CONCAT44(extraout_XMM0_Db_09,extraout_XMM0_Da_09);
                      in_XMM1_Qa = dVar30;
                      std::operator*((complex<double> *)
                                     ((long)mat1.data_._M_t.
                                            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                                            ._M_t.
                                            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                                            .super__Head_base<0UL,_std::complex<double>_*,_false>.
                                            _M_head_impl + mat1.size_ * 0x10 + 0x10),&x2);
                      auVar13._8_4_ = SUB84(in_XMM1_Qa + dVar30,0);
                      auVar13._0_8_ =
                           (double)CONCAT44(extraout_XMM0_Db_10,extraout_XMM0_Da_10) + local_e8;
                      auVar13._12_4_ = (int)((ulong)(in_XMM1_Qa + dVar30) >> 0x20);
                      *(undefined1 (*) [16])
                       ((matrix->data_)._M_t.
                        super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
                        .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl[lVar28].
                        _M_value + lVar26 + matrix->size_ * uVar29) = auVar13;
                    }
                    lVar26 = lVar26 + 0x10;
                  }
                  lVar27 = lVar27 + lVar28 * 0x20;
                }
                uVar29 = uVar29 + 0x10;
              }
            }
          }
          std::unique_ptr<std::complex<double>[],_std::default_delete<std::complex<double>[]>_>::
          ~unique_ptr(&mat1.data_);
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    (&qubits.super__Vector_base<int,_std::allocator<int>_>);
          return;
        }
        __assertion = "qubits[1] < nbQubits";
      }
      else {
        __assertion = "qubits[0] < nbQubits";
      }
      uVar14 = 0x33;
    }
    else {
      __assertion = "matrix.size() == 1 << nbQubits";
      uVar14 = 0x2f;
    }
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qpixlpp/build_O2/_deps/qclabpp-src/src/qgates/QControlledGate2.cpp"
                ,uVar14,
                "virtual void qclab::qgates::QControlledGate2<std::complex<double>>::apply(Side, Op, const int, qclab::dense::SquareMatrix<T> &, const int) const [T = std::complex<double>]"
               );
}

Assistant:

void QControlledGate2< T >::apply( Side side , Op op , const int nbQubits ,
                                     qclab::dense::SquareMatrix< T >& matrix ,
                                     const int offset ) const {
    using matrix_type = qclab::dense::SquareMatrix< T > ;
    assert( nbQubits >= 2 ) ;
    assert( matrix.size() == 1 << nbQubits ) ;
    auto qubits = this->qubits() ;
    qubits[0] += offset ;
    qubits[1] += offset ;
    assert( qubits[0] < nbQubits ) ; assert( qubits[1] < nbQubits ) ;
    // operation
    matrix_type  mat1 = this->gate()->matrix() ;
    qclab::dense::operateInPlace( op , mat1 ) ;
    // control / target
    if ( control() < target() ) {
      // control() < target()
      const int64_t d = 1 << ( target() - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.rows(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t j = 0; j < nRight; j++ ) {
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            if ( controlState_ == 0 && ( k % d >= d/2 ) ) continue ;
            if ( controlState_ == 1 && ( k % d <  d/2 ) ) continue ;
            for ( int64_t i = 0; i < nRight; i++ ) {
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    } else {
      // control() >= target()
      const int64_t d = 1 << ( nbQubits - control() ) ;
      const int64_t nLeft  = 1 << target() ;
      const int64_t nRight = 1 << ( nbQubits - target() - 1 ) ;
      if ( side == Side::Left ) {
        #pragma omp parallel for
        for ( int64_t i = 0; i < matrix.cols(); i++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t j = 0; j < nRight; j++ ) {
              if ( controlState_ == 0 && ( j % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( j % d <  d/2 ) ) continue ;
              const int64_t j1 = j + 2 * k * nRight ;
              const int64_t j2 = j1 + nRight ;
              const T x1 = matrix(i,j1) ;
              const T x2 = matrix(i,j2) ;
              matrix(i,j1) = mat1(0,0) * x1 + mat1(1,0) * x2 ;
              matrix(i,j2) = mat1(0,1) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      } else {
        #pragma omp parallel for
        for ( int64_t j = 0; j < matrix.cols(); j++ ) {
          for ( int64_t k = 0; k < nLeft; k++ ) {
            for ( int64_t i = 0; i < nRight; i++ ) {
              if ( controlState_ == 0 && ( i % d >= d/2 ) ) continue ;
              if ( controlState_ == 1 && ( i % d <  d/2 ) ) continue ;
              const int64_t i1 = i + 2 * k * nRight ;
              const int64_t i2 = i1 + nRight ;
              const T x1 = matrix(i1,j) ;
              const T x2 = matrix(i2,j) ;
              matrix(i1,j) = mat1(0,0) * x1 + mat1(0,1) * x2 ;
              matrix(i2,j) = mat1(1,0) * x1 + mat1(1,1) * x2 ;
            }
          }
        }
      }
    }
  }